

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetAssetIssuanceTest_multi_Test::
ConfidentialTransaction_SetAssetIssuanceTest_multi_Test
          (ConfidentialTransaction_SetAssetIssuanceTest_multi_Test *this)

{
  ConfidentialTransaction_SetAssetIssuanceTest_multi_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialTransaction_SetAssetIssuanceTest_multi_Test_00891a20;
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetIssuanceTest_multi) {
  ConfidentialTransaction tx_base(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx1(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx2(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00060135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000001bf08eb00001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc01000000009502f90002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa160014144f003aa8dd6408ba0e8ee91757cf1f1976315c01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000017d78400001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000023c3460002d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590160014ae8cab151547d6f6e25b62b41200368dfdabe62b0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb53907700000000000000000000000000");

  std::vector<Amount> asset_amount_list;
  std::vector<Script> asset_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;
  std::vector<Amount> token_amount_list;
  std::vector<Script> token_script_list;
  std::vector<ConfidentialNonce> token_nonce_list;

  // empty check
  ConfidentialTransaction tx(tx_base);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  Script asset_script("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script token_script("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  ConfidentialNonce asset_nonce;
  ConfidentialNonce token_nonce;
  ByteData256 contract_hash;
  bool is_blind = false;
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx1.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // 2-output check
  tx = ConfidentialTransaction(tx_base);
  Amount asset_amount1 = Amount::CreateByCoinAmount(75.0);
  Amount asset_amount2 = Amount::CreateByCoinAmount(25.0);
  Script asset_script1("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script asset_script2("0014144f003aa8dd6408ba0e8ee91757cf1f1976315c");
  ConfidentialNonce asset_nonce1;
  ConfidentialNonce asset_nonce2("02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa");
  Amount token_amount1 = Amount::CreateByCoinAmount(4.0);
  Amount token_amount2 = Amount::CreateByCoinAmount(6.0);
  Script token_script1("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  Script token_script2("0014ae8cab151547d6f6e25b62b41200368dfdabe62b");
  ConfidentialNonce token_nonce1;
  ConfidentialNonce token_nonce2("02d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590");
  asset_amount_list.push_back(asset_amount1);
  asset_script_list.push_back(asset_script1);
  asset_nonce_list.push_back(asset_nonce1);
  asset_amount_list.push_back(asset_amount2);
  asset_script_list.push_back(asset_script2);
  asset_nonce_list.push_back(asset_nonce2);
  token_amount_list.push_back(token_amount1);
  token_script_list.push_back(token_script1);
  token_nonce_list.push_back(token_nonce1);
  token_amount_list.push_back(token_amount2);
  token_script_list.push_back(token_script2);
  token_nonce_list.push_back(token_nonce2);
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx2.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // error (count unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();
    token_amount_list.clear();
    token_script_list.clear();
    token_nonce_list.clear();
    asset_amount_list.push_back(asset_amount);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.push_back(asset_script1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_script_list.clear();
    token_amount_list.push_back(token_amount);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    token_amount_list.clear();
    token_script_list.push_back(token_script1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    token_script_list.clear();
  }
  // error (amount unmatch)
  {
    asset_amount_list.push_back(asset_amount1);
    asset_script_list.push_back(asset_script1);
    asset_nonce_list.push_back(asset_nonce1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();

    asset_amount_list.push_back(asset_amount);
    asset_script_list.push_back(asset_script1);
    asset_nonce_list.push_back(asset_nonce1);
    token_amount_list.push_back(token_amount1);
    token_script_list.push_back(token_script1);
    token_nonce_list.push_back(token_nonce1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();
    token_amount_list.clear();
    token_script_list.clear();
    token_nonce_list.clear();
  }
}